

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distance.cpp
# Opt level: O3

double Distance::getWeightedRobinsonFouldsDistance
                 (string *t1,string *t2,bool normalise,bool rooted1,bool rooted2)

{
  pointer pcVar1;
  double dVar2;
  PhyloTree b;
  PhyloTree a;
  string local_140;
  string local_120;
  PhyloTree local_100;
  PhyloTree local_98;
  
  pcVar1 = (t1->_M_dataplus)._M_p;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120,pcVar1,pcVar1 + t1->_M_string_length);
  PhyloTree::PhyloTree(&local_98,&local_120,rooted1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  pcVar1 = (t2->_M_dataplus)._M_p;
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,pcVar1,pcVar1 + t2->_M_string_length);
  PhyloTree::PhyloTree(&local_100,&local_140,rooted2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  dVar2 = getWeightedRobinsonFouldsDistance(&local_98,&local_100,normalise);
  if (local_100.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.leaf2NumMap);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_100.edges);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.newick._M_dataplus._M_p != &local_100.newick.field_2) {
    operator_delete(local_100.newick._M_dataplus._M_p);
  }
  if (local_98.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.leafEdgeLengths.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98.leaf2NumMap);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_98.edges);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.newick._M_dataplus._M_p != &local_98.newick.field_2) {
    operator_delete(local_98.newick._M_dataplus._M_p);
  }
  return dVar2;
}

Assistant:

double Distance::getWeightedRobinsonFouldsDistance(const string& t1, const string& t2, bool normalise, bool rooted1, bool rooted2) {
    PhyloTree a(t1, rooted1);
    PhyloTree b(t2, rooted2);
    return getWeightedRobinsonFouldsDistance(a, b, normalise);
}